

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

bool __thiscall IntBounds::SetIsNot(IntBounds *this,int constantValue,bool isExplicit)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool isExplicit_local;
  int constantValue_local;
  IntBounds *this_local;
  
  if (this->constantLowerBound == this->constantUpperBound) {
    this_local._7_1_ = false;
  }
  else {
    if (this->constantUpperBound <= this->constantLowerBound) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                         ,0xf6,"(constantLowerBound < constantUpperBound)",
                         "constantLowerBound < constantUpperBound");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (constantValue == this->constantLowerBound) {
      this->constantLowerBound = this->constantLowerBound + 1;
      this_local._7_1_ = true;
    }
    else if (constantValue == this->constantUpperBound) {
      this->constantUpperBound = this->constantUpperBound + -1;
      if (isExplicit) {
        this->wasConstantUpperBoundEstablishedExplicitly = true;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool IntBounds::SetIsNot(const int constantValue, const bool isExplicit)
{
    if(constantLowerBound == constantUpperBound)
        return false;

    Assert(constantLowerBound < constantUpperBound);
    if(constantValue == constantLowerBound)
    {
        ++constantLowerBound;
        return true;
    }
    if(constantValue == constantUpperBound)
    {
        --constantUpperBound;
        if(isExplicit)
            wasConstantUpperBoundEstablishedExplicitly = true;
        return true;
    }
    return false;
}